

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latch.cpp
# Opt level: O2

__pid_t __thiscall rtb::Concurrency::Latch::wait(Latch *this,void *__stat_loc)

{
  int iVar1;
  __pid_t extraout_EAX;
  logic_error *this_00;
  unique_lock<std::mutex> mlock;
  
  std::unique_lock<std::mutex>::unique_lock(&mlock,&this->mutex_);
  if (this->count_ == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"internal count == 0");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  iVar1 = this->count_ + -1;
  this->count_ = iVar1;
  if (iVar1 == 0) {
    std::condition_variable::notify_all();
  }
  else {
    while (0 < iVar1) {
      std::condition_variable::wait((unique_lock *)&this->condition_);
      iVar1 = this->count_;
    }
  }
  std::unique_lock<std::mutex>::unlock(&mlock);
  std::unique_lock<std::mutex>::~unique_lock(&mlock);
  return extraout_EAX;
}

Assistant:

void Latch::wait() {
            std::unique_lock<std::mutex> mlock(mutex_);
            if (count_ == 0) {
                throw std::logic_error("internal count == 0");
            }
            if (--count_ == 0)
                condition_.notify_all();
            else {
                while (count_ > 0)
                    condition_.wait(mlock);
            }
            mlock.unlock();
        }